

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dws.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* split(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *__return_storage_ptr__,string *str,string *delim)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar4 = 0;
  while (uVar1 = str->_M_string_length, uVar5 = uVar4, uVar4 < uVar1) {
    while ((uVar5 < uVar1 &&
           (lVar2 = std::__cxx11::string::find
                              ((char)delim,(ulong)(uint)(int)(str->_M_dataplus)._M_p[uVar5]),
           lVar2 != -1))) {
      uVar1 = str->_M_string_length;
      uVar5 = uVar5 + 1;
    }
    lVar2 = 0;
    uVar4 = uVar5;
    while ((uVar4 < str->_M_string_length &&
           (lVar3 = std::__cxx11::string::find
                              ((char)delim,(ulong)(uint)(int)(str->_M_dataplus)._M_p[uVar4]),
           lVar3 == -1))) {
      uVar4 = uVar4 + 1;
      lVar2 = lVar2 + -1;
    }
    if (lVar2 != 0) {
      std::__cxx11::string::string((string *)&local_50,(string *)str,uVar5,-lVar2);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<string> split(const string& str, const string& delim)
{
	vector<string> parts;
	size_t start;
	size_t end = 0;
	while (end < str.size())
	{
		start = end;
		while (start < str.size() && (delim.find(str[start]) != string::npos))
			start++; // skip initial whitespace
		end = start;
		while (end < str.size() && (delim.find(str[end]) == string::npos))
			end++; // skip to end of word
		if (end - start != 0) // just ignore zero-length strings.
			parts.push_back(string(str, start, end - start));
	}
	return parts;
}